

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O0

void libxml_xmlParserCtxtErrorHandler(void *ctx,xmlError *error)

{
  undefined8 *puVar1;
  PyObject *op;
  PyObject *pPVar2;
  int local_3c;
  int severity;
  xmlParserCtxtPyCtxtPtr pyCtxt;
  xmlParserCtxtPtr ctxt;
  PyObject *result;
  PyObject *list;
  xmlError *error_local;
  void *ctx_local;
  
  puVar1 = *(undefined8 **)((long)ctx + 0x1a8);
  if ((error->domain == 0x17) || (error->domain == 4)) {
    if (error->level == XML_ERR_WARNING) {
      local_3c = 1;
    }
    else {
      local_3c = 2;
    }
  }
  else if (error->level == XML_ERR_WARNING) {
    local_3c = 3;
  }
  else {
    local_3c = 4;
  }
  op = (PyObject *)PyTuple_New(4);
  PyTuple_SetItem(op,0,puVar1[1]);
  _Py_XINCREF((PyObject *)puVar1[1]);
  pPVar2 = libxml_constcharPtrWrap(error->message);
  PyTuple_SetItem(op,1,pPVar2);
  pPVar2 = libxml_intWrap(local_3c);
  PyTuple_SetItem(op,2,pPVar2);
  PyTuple_SetItem(op,3,&_Py_NoneStruct);
  _Py_INCREF((PyObject *)&_Py_NoneStruct);
  pPVar2 = (PyObject *)PyObject_CallObject(*puVar1,op);
  if (pPVar2 == (PyObject *)0x0) {
    PyErr_Print();
  }
  _Py_XDECREF(op);
  _Py_XDECREF(pPVar2);
  return;
}

Assistant:

static void
libxml_xmlParserCtxtErrorHandler(void *ctx, const xmlError *error)
{
    PyObject *list;
    PyObject *result;
    xmlParserCtxtPtr ctxt;
    xmlParserCtxtPyCtxtPtr pyCtxt;
    int severity;
    
    ctxt = (xmlParserCtxtPtr)ctx;
    pyCtxt = (xmlParserCtxtPyCtxtPtr)ctxt->_private;

    if ((error->domain == XML_FROM_VALID) ||
        (error->domain == XML_FROM_DTD)) {
        if (error->level == XML_ERR_WARNING)
            severity = XML_PARSER_SEVERITY_VALIDITY_WARNING;
        else
            severity = XML_PARSER_SEVERITY_VALIDITY_ERROR;
    } else {
        if (error->level == XML_ERR_WARNING)
            severity = XML_PARSER_SEVERITY_WARNING;
        else
            severity = XML_PARSER_SEVERITY_ERROR;
    }

    list = PyTuple_New(4);
    PyTuple_SetItem(list, 0, pyCtxt->arg);
    Py_XINCREF(pyCtxt->arg);
    PyTuple_SetItem(list, 1, libxml_constcharPtrWrap(error->message));
    PyTuple_SetItem(list, 2, libxml_intWrap(severity));
    PyTuple_SetItem(list, 3, Py_None);
    Py_INCREF(Py_None);
    result = PyObject_CallObject(pyCtxt->f, list);
    if (result == NULL) 
    {
	/* TODO: manage for the exception to be propagated... */
	PyErr_Print();
    }
    Py_XDECREF(list);
    Py_XDECREF(result);
}